

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_function_hasInstance(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  int iVar2;
  int ret;
  undefined1 in_stack_00000038 [16];
  undefined1 in_stack_00000048 [16];
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  iVar2 = JS_OrdinaryIsInstanceOf
                    ((JSContext *)this_val.tag,(JSValue)in_stack_00000048,(JSValue)in_stack_00000038
                    );
  if (iVar2 < 0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    local_30 = (uint)(iVar2 != 0);
    uStack_2c = uStack_c;
    local_28 = 1;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_function_hasInstance(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    int ret;
    ret = JS_OrdinaryIsInstanceOf(ctx, argv[0], this_val);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}